

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtIntersectTwo(word *pOut,int fComp,word *pIn0,int fComp0,word *pIn1,int fComp1,int nWords)

{
  int local_40;
  int w;
  int fComp1_local;
  word *pIn1_local;
  int fComp0_local;
  word *pIn0_local;
  int fComp_local;
  word *pOut_local;
  
  if ((fComp0 == 0) || (fComp1 == 0)) {
    if (fComp0 == 0) {
      if (fComp1 == 0) {
        if (fComp == 0) {
          for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
            if ((pIn0[local_40] & pIn1[local_40] & pOut[local_40]) != 0) {
              return 1;
            }
          }
        }
        else {
          for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
            if ((pIn0[local_40] & pIn1[local_40] & (pOut[local_40] ^ 0xffffffffffffffff)) != 0) {
              return 1;
            }
          }
        }
      }
      else if (fComp == 0) {
        for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
          if ((pIn0[local_40] & (pIn1[local_40] ^ 0xffffffffffffffff) & pOut[local_40]) != 0) {
            return 1;
          }
        }
      }
      else {
        for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
          if ((pIn0[local_40] & (pIn1[local_40] ^ 0xffffffffffffffff) &
              (pOut[local_40] ^ 0xffffffffffffffff)) != 0) {
            return 1;
          }
        }
      }
    }
    else if (fComp == 0) {
      for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
        if (((pIn0[local_40] ^ 0xffffffffffffffff) & pIn1[local_40] & pOut[local_40]) != 0) {
          return 1;
        }
      }
    }
    else {
      for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
        if (((pIn0[local_40] ^ 0xffffffffffffffff) & pIn1[local_40] &
            (pOut[local_40] ^ 0xffffffffffffffff)) != 0) {
          return 1;
        }
      }
    }
  }
  else if (fComp == 0) {
    for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
      if (((pIn0[local_40] ^ 0xffffffffffffffff) & (pIn1[local_40] ^ 0xffffffffffffffff) &
          pOut[local_40]) != 0) {
        return 1;
      }
    }
  }
  else {
    for (local_40 = 0; local_40 < nWords; local_40 = local_40 + 1) {
      if (((pIn0[local_40] ^ 0xffffffffffffffff) & (pIn1[local_40] ^ 0xffffffffffffffff) &
          (pOut[local_40] ^ 0xffffffffffffffff)) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Abc_TtIntersectTwo( word * pOut, int fComp, word * pIn0, int fComp0, word * pIn1, int fComp1, int nWords )
{
    int w;
    if ( fComp0 && fComp1 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn0[w] & ~pIn1[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn0[w] & ~pIn1[w] & pOut[w] )
                    return 1;
        }
    }
    else if ( fComp0 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn0[w] & pIn1[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( ~pIn0[w] & pIn1[w] & pOut[w] )
                    return 1;
        }
    }
    else if ( fComp1 )
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn0[w] & ~pIn1[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn0[w] & ~pIn1[w] & pOut[w] )
                    return 1;
        }
    }
    else 
    {
        if ( fComp )
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn0[w] & pIn1[w] & ~pOut[w] )
                    return 1;
        }
        else
        {
            for ( w = 0; w < nWords; w++ )
                if ( pIn0[w] & pIn1[w] & pOut[w] )
                    return 1;
        }
    }
    return 0;
}